

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O1

void Search::hoopla_permute(size_t *B,size_t *end)

{
  long lVar1;
  ulong *puVar2;
  unsigned_long *__i;
  size_t __n;
  ulong *puVar3;
  ulong *puVar4;
  unsigned_long *__ptr;
  ulong uVar5;
  ulong uVar6;
  value_type_conflict3 __val_2;
  size_t *psVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong *puVar15;
  ulong uVar16;
  ulong uVar17;
  size_t __n_00;
  ulong uVar18;
  value_type_conflict3 __val;
  
  uVar17 = (long)end - (long)B >> 3;
  __n = (long)end - (long)B;
  if (__n != 0) {
    lVar1 = 0x3f;
    if (uVar17 != 0) {
      for (; uVar17 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(unsigned_long,unsigned_long)>>
              (B,end,(ulong)(((uint)lVar1 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(unsigned_long,_unsigned_long)>)0x270247);
    puVar4 = B + 1;
    puVar15 = B;
    if ((long)__n < 0x81) {
      while (puVar8 = puVar4, puVar8 != end) {
        uVar5 = *puVar8;
        if (uVar5 < *B) {
          memmove((void *)((long)puVar15 + (0x10 - ((long)puVar8 - (long)B))),B,
                  (long)puVar8 - (long)B);
          puVar4 = B;
        }
        else {
          uVar6 = *puVar15;
          puVar4 = puVar8;
          while (uVar5 < uVar6) {
            *puVar4 = puVar4[-1];
            uVar6 = puVar4[-2];
            puVar4 = puVar4 + -1;
          }
        }
        *puVar4 = uVar5;
        puVar15 = puVar8;
        puVar4 = puVar8 + 1;
      }
    }
    else {
      __n_00 = 8;
      psVar7 = B;
      puVar15 = puVar4;
      do {
        puVar8 = (ulong *)((long)B + __n_00);
        uVar5 = *(ulong *)((long)B + __n_00);
        if (uVar5 < *B) {
          memmove(puVar4,B,__n_00);
          puVar3 = B;
        }
        else {
          uVar6 = *psVar7;
          puVar3 = puVar8;
          puVar2 = puVar15;
          while (uVar5 < uVar6) {
            puVar3 = puVar2 + -1;
            *puVar2 = puVar2[-1];
            uVar6 = puVar2[-2];
            puVar2 = puVar3;
          }
        }
        *puVar3 = uVar5;
        __n_00 = __n_00 + 8;
        puVar15 = puVar15 + 1;
        psVar7 = puVar8;
      } while (__n_00 != 0x80);
      for (puVar4 = B + 0x10; puVar4 != end; puVar4 = puVar4 + 1) {
        uVar5 = *puVar4;
        uVar6 = puVar4[-1];
        puVar15 = puVar4;
        while (uVar5 < uVar6) {
          *puVar15 = puVar15[-1];
          uVar6 = puVar15[-2];
          puVar15 = puVar15 + -1;
        }
        *puVar15 = uVar5;
      }
    }
  }
  __ptr = calloc_or_throw<unsigned_long>(uVar17 * 2 + 2);
  *(size_t *)((long)__ptr + __n) = *B;
  uVar5 = uVar17 - 1;
  __ptr[uVar17 + 1] = B[uVar17 - 1];
  if (1 < uVar5) {
    uVar6 = uVar17 + 1;
    uVar16 = 1;
    uVar9 = 0;
    do {
      uVar18 = B[uVar5 - 1];
      uVar14 = __ptr[uVar6];
      uVar10 = B[uVar16];
      uVar12 = uVar14 - uVar18;
      if (uVar14 < uVar18) {
        uVar12 = -(uVar14 - uVar18);
      }
      uVar11 = uVar14 - uVar10;
      if (uVar14 < uVar10) {
        uVar11 = -(uVar14 - uVar10);
      }
      uVar14 = __ptr[uVar17];
      uVar13 = uVar14 - uVar18;
      if (uVar14 < uVar18) {
        uVar13 = -(uVar14 - uVar18);
      }
      uVar18 = uVar14 - uVar10;
      if (uVar14 < uVar10) {
        uVar18 = -(uVar14 - uVar10);
      }
      uVar14 = uVar13;
      if (uVar13 < uVar18) {
        uVar14 = uVar18;
      }
      if (uVar12 < uVar11) {
        uVar12 = uVar11;
      }
      if (uVar12 < uVar14) {
        uVar12 = uVar14;
      }
      if (uVar18 < uVar12) {
        if (uVar13 < uVar12) {
          if (uVar12 <= uVar11) {
            uVar6 = uVar6 + 1;
            uVar18 = uVar6;
            uVar9 = uVar16;
            goto LAB_002687e3;
          }
          uVar10 = B[uVar5 - 1];
          uVar6 = uVar6 + 1;
          uVar18 = uVar6;
        }
        else {
          uVar10 = B[uVar5 - 1];
          uVar18 = uVar17 - 1;
          uVar17 = uVar18;
        }
        uVar5 = uVar5 - 1;
      }
      else {
        uVar18 = uVar17 - 1;
        uVar9 = uVar16;
        uVar17 = uVar18;
      }
LAB_002687e3:
      __ptr[uVar18] = uVar10;
      uVar16 = uVar9 + 1;
    } while (uVar16 < uVar5);
  }
  memcpy(B,__ptr + uVar17,__n);
  free(__ptr);
  return;
}

Assistant:

void hoopla_permute(size_t* B, size_t* end)
{
  // from Curtis IPL 2004, "Darts and hoopla board design"
  // first sort
  size_t N = end - B;
  std::sort(B, end, cmp_size_t);
  // make some temporary space
  size_t* A = calloc_or_throw<size_t>((N + 1) * 2);
  A[N] = B[0];                // arbitrarily choose the maximum in the middle
  A[N + 1] = B[N - 1];        // so the maximum goes next to it
  size_t lo = N, hi = N + 1;  // which parts of A have we filled in? [lo,hi]
  size_t i = 0, j = N - 1;    // which parts of B have we already covered? [0,i] and [j,N-1]
  while (i + 1 < j)
  {
    // there are four options depending on where things get placed
    size_t d1 = absdiff(A[lo], B[i + 1]);  // put B[i+1] at the bottom
    size_t d2 = absdiff(A[lo], B[j - 1]);  // put B[j-1] at the bottom
    size_t d3 = absdiff(A[hi], B[i + 1]);  // put B[i+1] at the top
    size_t d4 = absdiff(A[hi], B[j - 1]);  // put B[j-1] at the top
    size_t mx = max(max(d1, d2), max(d3, d4));
    if (d1 >= mx)
      A[--lo] = B[++i];
    else if (d2 >= mx)
      A[--lo] = B[--j];
    else if (d3 >= mx)
      A[++hi] = B[++i];
    else
      A[++hi] = B[--j];
  }
  // copy it back to B
  memcpy(B, A + lo, N * sizeof(size_t));
  // clean up
  free(A);
}